

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ScaleLayerParams::InternalSwap
          (ScaleLayerParams *this,ScaleLayerParams *other)

{
  bool bVar1;
  intptr_t iVar2;
  void *pvVar3;
  void *pvVar4;
  WeightParams *pWVar5;
  WeightParams *pWVar6;
  WeightParams *pWVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  LogMessage *pLVar11;
  LogFinisher local_89;
  LogMessage local_88;
  LogMessage local_50;
  
  iVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar2;
  if (this == other) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x324);
    pLVar11 = google::protobuf::internal::LogMessage::operator<<
                        (&local_50,"CHECK failed: this != other: ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar11);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar9 = (this->shapescale_).current_size_;
  iVar10 = (this->shapescale_).total_size_;
  pvVar3 = (this->shapescale_).arena_or_elements_;
  iVar8 = (other->shapescale_).total_size_;
  pvVar4 = (other->shapescale_).arena_or_elements_;
  (this->shapescale_).current_size_ = (other->shapescale_).current_size_;
  (this->shapescale_).total_size_ = iVar8;
  (this->shapescale_).arena_or_elements_ = pvVar4;
  (other->shapescale_).current_size_ = iVar9;
  (other->shapescale_).total_size_ = iVar10;
  (other->shapescale_).arena_or_elements_ = pvVar3;
  if (this == other) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_88,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x324);
    pLVar11 = google::protobuf::internal::LogMessage::operator<<
                        (&local_88,"CHECK failed: this != other: ");
    google::protobuf::internal::LogFinisher::operator=(&local_89,pLVar11);
    google::protobuf::internal::LogMessage::~LogMessage(&local_88);
  }
  iVar9 = (this->shapebias_).current_size_;
  iVar10 = (this->shapebias_).total_size_;
  pvVar3 = (this->shapebias_).arena_or_elements_;
  iVar8 = (other->shapebias_).total_size_;
  pvVar4 = (other->shapebias_).arena_or_elements_;
  (this->shapebias_).current_size_ = (other->shapebias_).current_size_;
  (this->shapebias_).total_size_ = iVar8;
  (this->shapebias_).arena_or_elements_ = pvVar4;
  (other->shapebias_).current_size_ = iVar9;
  (other->shapebias_).total_size_ = iVar10;
  (other->shapebias_).arena_or_elements_ = pvVar3;
  pWVar5 = this->scale_;
  pWVar6 = this->bias_;
  pWVar7 = other->bias_;
  this->scale_ = other->scale_;
  this->bias_ = pWVar7;
  other->scale_ = pWVar5;
  other->bias_ = pWVar6;
  bVar1 = this->hasbias_;
  this->hasbias_ = other->hasbias_;
  other->hasbias_ = bVar1;
  return;
}

Assistant:

void ScaleLayerParams::InternalSwap(ScaleLayerParams* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  shapescale_.InternalSwap(&other->shapescale_);
  shapebias_.InternalSwap(&other->shapebias_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(ScaleLayerParams, hasbias_)
      + sizeof(ScaleLayerParams::hasbias_)
      - PROTOBUF_FIELD_OFFSET(ScaleLayerParams, scale_)>(
          reinterpret_cast<char*>(&scale_),
          reinterpret_cast<char*>(&other->scale_));
}